

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaxEpsRefine.h
# Opt level: O0

dfa_t * __thiscall
covenant::MaxEpsRefine<covenant::Sym>::maximum_refinement
          (MaxEpsRefine<covenant::Sym> *this,cond_eps_gen_t *gen,int qi,int qj)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int in_ECX;
  CondEpsGen<covenant::Sym> *in_RDX;
  CondEpsGen<covenant::Sym> *in_RDI;
  int in_R8D;
  uint in_stack_000000c0;
  uint in_stack_000000c4;
  DFA<covenant::Sym> *in_stack_000000c8;
  dfa_t include_dfa_1;
  uint in_stack_000001e0;
  uint in_stack_000001e4;
  DFA<covenant::Sym> *in_stack_000001e8;
  dfa_t include_dfa;
  int qi_next;
  int qj_next;
  dfa_t *ret_dfa;
  DFA<covenant::Sym> *in_stack_fffffffffffffcd8;
  DFA<covenant::Sym> *in_stack_fffffffffffffce0;
  undefined2 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf2;
  undefined1 in_stack_fffffffffffffcf3;
  CondEpsGen<covenant::Sym> *this_00;
  int in_stack_fffffffffffffd24;
  int in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd2c;
  CondEpsGen<covenant::Sym> *in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  CondEpsGen<covenant::Sym> *in_stack_fffffffffffffd50;
  CondEpsGen<covenant::Sym> *in_stack_fffffffffffffd88;
  DFA<covenant::Sym> *in_stack_fffffffffffffe30;
  dfa_t *in_stack_fffffffffffffe58;
  DFA<covenant::Sym> *in_stack_fffffffffffffe60;
  int qj_00;
  int iVar5;
  CondEpsGen<covenant::Sym> *this_01;
  
  this_00 = in_RDI;
  iVar5 = in_ECX;
  iVar2 = CondEpsGen<covenant::Sym>::nStates(in_RDX);
  if (iVar2 < in_ECX) {
    CondEpsGen<covenant::Sym>::emit_dfa(in_stack_fffffffffffffd88);
  }
  else {
    iVar2 = in_R8D;
    iVar3 = CondEpsGen<covenant::Sym>::nStates(in_RDX);
    if (iVar3 <= in_R8D) {
      __assert_fail("qj < gen.nStates()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/caballa[P]covenant/include/refinement/MaxEpsRefine.h"
                    ,0x31,
                    "dfa_t covenant::MaxEpsRefine<covenant::Sym>::maximum_refinement(cond_eps_gen_t &, int, int) [EdgeSym = covenant::Sym]"
                   );
    }
    iVar4 = iVar2 + 1;
    iVar3 = CondEpsGen<covenant::Sym>::nStates(in_RDX);
    iVar4 = iVar4 % iVar3;
    iVar3 = iVar5;
    if (iVar4 == 0) {
      iVar3 = iVar5 + 1;
    }
    qj_00 = iVar3;
    maximum_refinement((MaxEpsRefine<covenant::Sym> *)in_RDX,(cond_eps_gen_t *)CONCAT44(iVar5,iVar2)
                       ,iVar4,iVar3);
    DFA<covenant::Sym>::eps_elim(in_stack_fffffffffffffe30);
    CondEpsGen<covenant::Sym>::push
              ((CondEpsGen<covenant::Sym> *)
               CONCAT44(iVar3,CONCAT13(in_stack_fffffffffffffcf3,
                                       CONCAT12(in_stack_fffffffffffffcf2,in_stack_fffffffffffffcf0)
                                      )));
    if (iVar5 < iVar2) {
      bVar1 = CondEpsGen<covenant::Sym>::addEpsTrans
                        (in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
                         in_stack_fffffffffffffd48);
      if (bVar1) {
        maximum_refinement((MaxEpsRefine<covenant::Sym> *)in_RDX,
                           (cond_eps_gen_t *)CONCAT44(iVar5,iVar2),iVar4,qj_00);
        DFA<covenant::Sym>::eps_elim(in_stack_fffffffffffffe30);
        DFA<covenant::Sym>::nondet_union(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        DFA<covenant::Sym>::makeDFA(in_stack_000001e8,in_stack_000001e4,in_stack_000001e0);
        DFA<covenant::Sym>::minimize(in_stack_000000c8,in_stack_000000c4,in_stack_000000c0);
        DFA<covenant::Sym>::operator=(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        DFA<covenant::Sym>::~DFA(in_stack_fffffffffffffce0);
        DFA<covenant::Sym>::~DFA(in_stack_fffffffffffffce0);
        DFA<covenant::Sym>::~DFA(in_stack_fffffffffffffce0);
      }
    }
    else if (iVar2 < iVar5) {
      this_01 = in_RDX;
      std::vector<int,_std::allocator<int>_>::operator[](&in_RDX->word,(long)(iVar5 + -1));
      bVar1 = CondEpsGen<covenant::Sym>::addTrans
                        (in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,
                         in_stack_fffffffffffffd28,in_stack_fffffffffffffd24);
      if (bVar1) {
        maximum_refinement((MaxEpsRefine<covenant::Sym> *)this_01,
                           (cond_eps_gen_t *)CONCAT44(iVar5,iVar2),iVar4,qj_00);
        DFA<covenant::Sym>::eps_elim(in_stack_fffffffffffffe30);
        DFA<covenant::Sym>::nondet_union(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        DFA<covenant::Sym>::makeDFA(in_stack_000001e8,in_stack_000001e4,in_stack_000001e0);
        DFA<covenant::Sym>::minimize(in_stack_000000c8,in_stack_000000c4,in_stack_000000c0);
        DFA<covenant::Sym>::operator=((DFA<covenant::Sym> *)in_RDX,in_stack_fffffffffffffcd8);
        DFA<covenant::Sym>::~DFA((DFA<covenant::Sym> *)in_RDX);
        DFA<covenant::Sym>::~DFA((DFA<covenant::Sym> *)in_RDX);
        DFA<covenant::Sym>::~DFA((DFA<covenant::Sym> *)in_RDX);
      }
    }
    CondEpsGen<covenant::Sym>::pop(this_00);
  }
  return (dfa_t *)in_RDI;
}

Assistant:

dfa_t maximum_refinement(cond_eps_gen_t& gen, int qi, int qj)
    {
      if(qi > gen.nStates())
        return gen.emit_dfa();
      assert(qj < gen.nStates());

      int qj_next = (qj+1)%gen.nStates();
      int qi_next = (qj_next == 0) ? qi+1 : qi;
      
      dfa_t ret_dfa(maximum_refinement(gen, qi_next, qj_next));
      ret_dfa.eps_elim();

      gen.push();

      if(qi < qj)
      {
        // Forwards; an epsilon transition
        if(gen.addEpsTrans(qi, qj))
        {
          dfa_t include_dfa(maximum_refinement(gen, qi_next, qj_next));
          include_dfa.eps_elim();
          ret_dfa.nondet_union(include_dfa);
#if 1
          // Important to keep smaller the automata
          ret_dfa = ret_dfa.makeDFA (alphstart, alphsz).
              minimize (alphstart, alphsz);
              
#endif 
 
        }
      } 
      else if (qj < qi) {
        // Backwards, an input-consuming transition 
        if(gen.addTrans(qi-1, gen.word[qi-1], qj))
        {
          dfa_t include_dfa(maximum_refinement(gen, 
                                               qi_next, 
                                               qj_next));
          include_dfa.eps_elim();
          ret_dfa.nondet_union (include_dfa);
#if 1
          // Important to keep smaller the automata
          ret_dfa = ret_dfa.makeDFA (alphstart, alphsz).
              minimize (alphstart, alphsz);
#endif 
        } 
      }
      gen.pop();
      
      return ret_dfa;
    }